

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

bool __thiscall xla::GraphCycles::CanContractEdge(GraphCycles *this,int32_t a,int32_t b)

{
  bool bVar1;
  const_iterator cVar2;
  key_type_conflict1 local_24;
  
  cVar2 = std::
          _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->rep_->node_io_).
                  super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                  ._M_impl.super__Vector_impl_data._M_start[a].out.value_to_index_._M_h,&local_24);
  if (cVar2.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur != (__node_type *)0x0
     ) {
    RemoveEdge(this,a,b);
    bVar1 = IsReachableNonConst(this,a,b);
    InsertEdge(this,a,b);
    return !bVar1;
  }
  __assert_fail("HasEdge(a, b) && \"No edge exists from a to b\"",
                "/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/third_party/xla/graphcycles.cc"
                ,0x1b2,"bool xla::GraphCycles::CanContractEdge(int32_t, int32_t)");
}

Assistant:

bool GraphCycles::CanContractEdge(int32_t a, int32_t b) {
  assert(HasEdge(a, b) && "No edge exists from a to b");
  RemoveEdge(a, b);
  bool reachable = IsReachableNonConst(a, b);
  // Restore the graph to its original state.
  InsertEdge(a, b);
  // If reachable, then contracting edge will cause cycle.
  return !reachable;
}